

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretFloat64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  char *pcVar4;
  I64ToI32Lowering *pIVar5;
  Call *pCVar6;
  LocalSet *append;
  Block *any;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> expression;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  Module *this_00;
  string_view sVar7;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_01;
  Name target_01;
  Expression *local_d0;
  Const *local_c8;
  Const *local_c0;
  undefined1 local_b8 [8];
  TempVar highBits;
  long local_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  Builder *local_68;
  Call *local_60;
  I64ToI32Lowering *local_58;
  _Head_base<0UL,_wasm::Memory_*,_false> local_50;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  pointer local_40;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  getTemp((TempVar *)local_b8,this,(Type)0x2);
  pcVar4 = DAT_010b1118;
  sVar3 = ABI::wasm2js::SCRATCH_STORE_F64;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_d0 = curr->value;
  __l._M_len = 1;
  __l._M_array = &local_d0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffb0,__l,&local_33);
  target.super_IString.str._M_str = pcVar4;
  target.super_IString.str._M_len = sVar3;
  local_60 = Builder::makeCall(pBVar1,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &stack0xffffffffffffffb0,(Type)0x0,false);
  pcVar4 = DAT_010b10c8;
  sVar3 = ABI::wasm2js::SCRATCH_LOAD_I32;
  local_68 = pBVar1;
  if ((char)highBits.pass != '\x01') {
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    local_58 = this;
    local_c8 = Builder::makeConst<int>(pBVar1,1);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_c8;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&highBits.ty,
               __l_00,&local_32);
    target_00.super_IString.str._M_str = pcVar4;
    target_00.super_IString.str._M_len = sVar3;
    pCVar6 = Builder::makeCall(pBVar1,target_00,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &highBits.ty,(Type)0x2,false);
    append = Builder::makeLocalSet(pBVar1,local_b8._0_4_,(Expression *)pCVar6);
    pcVar4 = DAT_010b10c8;
    sVar3 = ABI::wasm2js::SCRATCH_LOAD_I32;
    pBVar1 = (local_58->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    local_c0 = Builder::makeConst<int>(pBVar1,0);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_c0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_80,__l_01,&local_31);
    args = &local_80;
    target_01.super_IString.str._M_str = pcVar4;
    target_01.super_IString.str._M_len = sVar3;
    pCVar6 = Builder::makeCall(pBVar1,target_01,args,(Type)0x2,false);
    pIVar5 = local_58;
    pBVar1 = local_68;
    any = Builder::blockify(local_68,(Expression *)local_60,(Expression *)append);
    expression.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)
         Builder::blockify(pBVar1,(Expression *)any,(Expression *)pCVar6);
    if (local_80.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (highBits.ty.id != 0) {
      operator_delete((void *)highBits.ty.id,local_88 - highBits.ty.id);
    }
    if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)local_50._M_head_impl
        != (Memory *)0x0) {
      operator_delete(local_50._M_head_impl,(long)local_40 - (long)local_50._M_head_impl);
    }
    local_50._M_head_impl =
         (Memory *)
         expression.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    std::
    _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
              ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&pIVar5->highBitVars,&stack0xffffffffffffffb0,local_b8);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(pIVar5->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)
               expression.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    this_00 = (pIVar5->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
              currModule;
    if ((this_00->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sVar7 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xdf9ff1),SUB81(args,0));
      local_50._M_head_impl = (Memory *)operator_new(0x58);
      ((local_50._M_head_impl)->max).addr = 0;
      *(undefined8 *)&(local_50._M_head_impl)->shared = 0;
      ((local_50._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_50._M_head_impl)->initial).addr = 0;
      ((local_50._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_50._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_50._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_50._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_50._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar7;
      ((local_50._M_head_impl)->addressType).id = 2;
      args = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)0x1;
      ((local_50._M_head_impl)->max).addr = 1;
      ((local_50._M_head_impl)->initial).addr = 1;
      Module::addMemory(this_00,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                &stack0xffffffffffffffb0);
      if (local_50._M_head_impl != (Memory *)0x0) {
        operator_delete(local_50._M_head_impl,0x58);
      }
      this_00 = (pIVar5->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
                currModule;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = args;
    ABI::wasm2js::ensureHelpers((wasm2js *)this_00,(Module *)0x0,(IString)(auVar2 << 0x40));
    TempVar::~TempVar((TempVar *)local_b8);
    return;
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerReinterpretFloat64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our f64 through memory at address 0
    TempVar highBits = getTemp();
    Block* result = builder->blockify(
      builder->makeCall(
        ABI::wasm2js::SCRATCH_STORE_F64, {curr->value}, Type::none),
      builder->makeLocalSet(highBits,
                            builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                                              {builder->makeConst(int32_t(1))},
                                              Type::i32)),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                        {builder->makeConst(int32_t(0))},
                        Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }